

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.cc
# Opt level: O0

void __thiscall
testing::internal::UnorderedElementsAreMatcherImplBase::DescribeToImpl
          (UnorderedElementsAreMatcherImplBase *this,ostream *os)

{
  bool bVar1;
  Flags FVar2;
  size_type sVar3;
  ostream *poVar4;
  const_reference ppMVar5;
  ulong local_38;
  size_t i;
  char *sep;
  Message local_20;
  ostream *local_18;
  ostream *os_local;
  UnorderedElementsAreMatcherImplBase *this_local;
  
  local_18 = os;
  os_local = (ostream *)this;
  FVar2 = match_flags(this);
  if (FVar2 == Superset) {
    std::operator<<(local_18,"a surjection from elements to requirements exists such that:\n");
  }
  else if (FVar2 == Subset) {
    std::operator<<(local_18,"an injection from elements to requirements exists such that:\n");
  }
  else if (FVar2 == ExactMatch) {
    bVar1 = std::
            vector<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
            ::empty((vector<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
                     *)(this + 8));
    if (bVar1) {
      std::operator<<(local_18,"is empty");
      return;
    }
    sVar3 = std::
            vector<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
            ::size((vector<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
                    *)(this + 8));
    if (sVar3 == 1) {
      poVar4 = std::operator<<(local_18,"has ");
      Elements((UnorderedElementsAreMatcherImplBase *)&local_20,1);
      poVar4 = testing::operator<<(poVar4,&local_20);
      std::operator<<(poVar4," and that element ");
      Message::~Message(&local_20);
      ppMVar5 = std::
                vector<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
                ::operator[]((vector<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
                              *)(this + 8),0);
      (*(*ppMVar5)->_vptr_MatcherDescriberInterface[2])(*ppMVar5,local_18);
      return;
    }
    poVar4 = std::operator<<(local_18,"has ");
    sVar3 = std::
            vector<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
            ::size((vector<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
                    *)(this + 8));
    Elements((UnorderedElementsAreMatcherImplBase *)&sep,sVar3);
    poVar4 = testing::operator<<(poVar4,(Message *)&sep);
    std::operator<<(poVar4," and there exists some permutation of elements such that:\n");
    Message::~Message((Message *)&sep);
  }
  i = (long)"%s from %s (%s ms total)\n\n" + 0x1a;
  for (local_38 = 0;
      sVar3 = std::
              vector<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
              ::size((vector<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
                      *)(this + 8)), local_38 != sVar3; local_38 = local_38 + 1) {
    std::operator<<(local_18,(char *)i);
    FVar2 = match_flags(this);
    if (FVar2 == ExactMatch) {
      poVar4 = std::operator<<(local_18," - element #");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_38);
      std::operator<<(poVar4," ");
    }
    else {
      std::operator<<(local_18," - an element ");
    }
    ppMVar5 = std::
              vector<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
              ::operator[]((vector<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
                            *)(this + 8),local_38);
    (*(*ppMVar5)->_vptr_MatcherDescriberInterface[2])(*ppMVar5,local_18);
    FVar2 = match_flags(this);
    if (FVar2 == ExactMatch) {
      i = (size_t)anon_var_dwarf_b38fc;
    }
    else {
      i = (long)"%s from %s (%s ms total)\n\n" + 0x19;
    }
  }
  return;
}

Assistant:

void UnorderedElementsAreMatcherImplBase::DescribeToImpl(
    ::std::ostream* os) const {
  switch (match_flags()) {
    case UnorderedMatcherRequire::ExactMatch:
      if (matcher_describers_.empty()) {
        *os << "is empty";
        return;
      }
      if (matcher_describers_.size() == 1) {
        *os << "has " << Elements(1) << " and that element ";
        matcher_describers_[0]->DescribeTo(os);
        return;
      }
      *os << "has " << Elements(matcher_describers_.size())
          << " and there exists some permutation of elements such that:\n";
      break;
    case UnorderedMatcherRequire::Superset:
      *os << "a surjection from elements to requirements exists such that:\n";
      break;
    case UnorderedMatcherRequire::Subset:
      *os << "an injection from elements to requirements exists such that:\n";
      break;
  }

  const char* sep = "";
  for (size_t i = 0; i != matcher_describers_.size(); ++i) {
    *os << sep;
    if (match_flags() == UnorderedMatcherRequire::ExactMatch) {
      *os << " - element #" << i << " ";
    } else {
      *os << " - an element ";
    }
    matcher_describers_[i]->DescribeTo(os);
    if (match_flags() == UnorderedMatcherRequire::ExactMatch) {
      sep = ", and\n";
    } else {
      sep = "\n";
    }
  }
}